

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O2

void __thiscall cmCMakePresetsGraph::ConfigurePreset::ConfigurePreset(ConfigurePreset *this)

{
  _Rb_tree_header *p_Var1;
  
  Preset::Preset(&this->super_Preset);
  (this->super_Preset)._vptr_Preset = (_func_int **)&PTR__ConfigurePreset_0077bd98;
  (this->Generator)._M_dataplus._M_p = (pointer)&(this->Generator).field_2;
  (this->Generator)._M_string_length = 0;
  (this->Generator).field_2._M_local_buf[0] = '\0';
  (this->Architecture)._M_dataplus._M_p = (pointer)&(this->Architecture).field_2;
  (this->Architecture)._M_string_length = 0;
  (this->Architecture).field_2._M_local_buf[0] = '\0';
  (this->ArchitectureStrategy).
  super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>._M_payload.
  super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy>._M_engaged = false;
  (this->Toolset)._M_dataplus._M_p = (pointer)&(this->Toolset).field_2;
  (this->Toolset)._M_string_length = 0;
  (this->Toolset).field_2._M_local_buf[0] = '\0';
  (this->ToolsetStrategy).super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>
  ._M_payload.super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy>._M_engaged =
       false;
  (this->ToolchainFile)._M_dataplus._M_p = (pointer)&(this->ToolchainFile).field_2;
  (this->ToolchainFile)._M_string_length = 0;
  (this->ToolchainFile).field_2._M_local_buf[0] = '\0';
  (this->BinaryDir)._M_dataplus._M_p = (pointer)&(this->BinaryDir).field_2;
  (this->BinaryDir)._M_string_length = 0;
  (this->BinaryDir).field_2._M_local_buf[0] = '\0';
  (this->InstallDir)._M_dataplus._M_p = (pointer)&(this->InstallDir).field_2;
  (this->InstallDir)._M_string_length = 0;
  (this->InstallDir).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->CacheVariables)._M_t._M_impl.super__Rb_tree_header;
  (this->CacheVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CacheVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->CacheVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->CacheVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->CacheVariables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->WarnDev).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool>._M_engaged = false;
  (this->ErrorDev).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool>._M_engaged = false;
  (this->WarnDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool>._M_engaged = false;
  (this->ErrorDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool>._M_engaged = false;
  (this->WarnUninitialized).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool>._M_engaged = false;
  (this->WarnUnusedCli).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool>._M_engaged = false;
  (this->WarnSystemVars).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool>._M_engaged = false;
  (this->DebugOutput).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool>._M_engaged = false;
  (this->DebugTryCompile).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool>._M_engaged = false;
  (this->DebugFind).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool>._M_engaged = false;
  return;
}

Assistant:

ConfigurePreset() = default;